

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

StringRef __thiscall llvm::Twine::toNullTerminatedStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  bool bVar1;
  NodeKind NVar2;
  undefined8 uVar3;
  Twine *pTVar4;
  size_t sVar5;
  char local_71;
  Child local_70;
  string *str;
  SmallVectorImpl<char> *Out_local;
  Twine *this_local;
  size_t local_50;
  Twine *local_48;
  Twine **local_40;
  
  str = (string *)Out;
  Out_local = (SmallVectorImpl<char> *)this;
  bVar1 = isUnary(this);
  if (bVar1) {
    NVar2 = getLHSKind(this);
    if (NVar2 == CStringKind) {
      local_48 = (this->LHS).twine;
      local_40 = &this_local;
      this_local = local_48;
      if (local_48 == (Twine *)0x0) {
        return _this_local;
      }
      strlen((char *)local_48);
      return _this_local;
    }
    if (NVar2 == StdStringKind) {
      local_70 = this->LHS;
      pTVar4 = (Twine *)std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::size();
      this_local = pTVar4;
      local_50 = uVar3;
      return _this_local;
    }
  }
  toVector(this,(SmallVectorImpl<char> *)str);
  local_71 = '\0';
  SmallVectorTemplateBase<char,_true>::push_back
            ((SmallVectorTemplateBase<char,_true> *)str,&local_71);
  SmallVectorTemplateBase<char,_true>::pop_back((SmallVectorTemplateBase<char,_true> *)str);
  pTVar4 = (Twine *)SmallVectorTemplateCommon<char,_void>::data
                              ((SmallVectorTemplateCommon<char,_void> *)str);
  sVar5 = SmallVectorBase::size((SmallVectorBase *)str);
  this_local = pTVar4;
  local_50 = sVar5;
  return _this_local;
}

Assistant:

StringRef Twine::toNullTerminatedStringRef(SmallVectorImpl<char> &Out) const {
  if (isUnary()) {
    switch (getLHSKind()) {
    case CStringKind:
      // Already null terminated, yay!
      return StringRef(LHS.cString);
    case StdStringKind: {
      const std::string *str = LHS.stdString;
      return StringRef(str->c_str(), str->size());
    }
    default:
      break;
    }
  }
  toVector(Out);
  Out.push_back(0);
  Out.pop_back();
  return StringRef(Out.data(), Out.size());
}